

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t roaring_bitmap_minimum(roaring_bitmap_t *bm)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  bitset_container_t *container;
  
  if ((bm->high_low_container).size < 1) {
    uVar4 = 0xffffffff;
  }
  else {
    container = (bitset_container_t *)*(bm->high_low_container).containers;
    uVar1 = *(bm->high_low_container).typecodes;
    if (uVar1 == '\x04') {
      uVar1 = *(uint8_t *)&container->words;
      container = *(bitset_container_t **)container;
    }
    uVar2 = *(bm->high_low_container).keys;
    if ((uVar1 == '\x03') || (uVar1 == '\x02')) {
      if (container->cardinality == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (uint16_t)*container->words;
      }
    }
    else {
      uVar3 = bitset_container_minimum(container);
    }
    uVar4 = CONCAT22(uVar2,uVar3);
  }
  return uVar4;
}

Assistant:

uint32_t roaring_bitmap_minimum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *c = bm->high_low_container.containers[0];
        uint8_t type = bm->high_low_container.typecodes[0];
        uint32_t key = bm->high_low_container.keys[0];
        uint32_t lowvalue = container_minimum(c, type);
        return lowvalue | (key << 16);
    }
    return UINT32_MAX;
}